

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O3

uint Curl_ipv6_scope(sockaddr *sa)

{
  uint uVar1;
  undefined4 uVar4;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  
  uVar1 = 0;
  if (sa->sa_family == 10) {
    uVar1 = 3;
    if ((sa->sa_data[6] & 0xfeU) != 0xfc) {
      uVar1 = (byte)sa->sa_data[7] & 0xffffffc0 | (uint)(byte)sa->sa_data[6] << 8;
      if (uVar1 == 0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(sa->sa_data + 8);
        uVar4 = (undefined4)(*(ulong *)(sa->sa_data + 8) >> 0x20);
        auVar5._4_4_ = uVar4;
        auVar5._0_4_ = uVar4;
        auVar5._8_4_ = uVar4;
        auVar5._12_4_ = uVar4;
        auVar5 = auVar5 | auVar2;
        auVar3._0_4_ = auVar5._0_4_ >> 0x10;
        auVar3._4_4_ = 0;
        auVar3._8_4_ = auVar5._8_4_ >> 0x10;
        auVar3._12_4_ = auVar5._12_4_ >> 0x10;
        uVar1 = *(uint *)sa[1].sa_data >> 0x10 | *(uint *)sa[1].sa_data;
        if (((((char)(uVar1 >> 8) != '\0' || (char)uVar1 != '\0') ||
             (SUB161(auVar3 | auVar5,1) != '\0' || SUB161(auVar3 | auVar5,0) != '\0')) ||
            sa[1].sa_data[4] != '\0') || sa->sa_data[7] != 0) {
          return 0;
        }
        uVar1 = 4;
        if (sa[1].sa_data[5] != '\x01') {
          return 0;
        }
      }
      else if (uVar1 == 0xfe80) {
        uVar1 = 1;
      }
      else {
        if (uVar1 != 0xfec0) {
          return 0;
        }
        uVar1 = 2;
      }
    }
  }
  return uVar1;
}

Assistant:

unsigned int Curl_ipv6_scope(const struct sockaddr *sa)
{
  if(sa->sa_family == AF_INET6) {
    const struct sockaddr_in6 * sa6 =
      (const struct sockaddr_in6 *)(const void *) sa;
    const unsigned char *b = sa6->sin6_addr.s6_addr;
    unsigned short w = (unsigned short) ((b[0] << 8) | b[1]);

    if((b[0] & 0xFE) == 0xFC) /* Handle ULAs */
      return IPV6_SCOPE_UNIQUELOCAL;
    switch(w & 0xFFC0) {
    case 0xFE80:
      return IPV6_SCOPE_LINKLOCAL;
    case 0xFEC0:
      return IPV6_SCOPE_SITELOCAL;
    case 0x0000:
      w = b[1] | b[2] | b[3] | b[4] | b[5] | b[6] | b[7] | b[8] | b[9] |
          b[10] | b[11] | b[12] | b[13] | b[14];
      if(w || b[15] != 0x01)
        break;
      return IPV6_SCOPE_NODELOCAL;
    default:
      break;
    }
  }
  return IPV6_SCOPE_GLOBAL;
}